

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

void __thiscall minihttp::HttpSocket::HttpSocket(HttpSocket *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_TcpSocket)._inbufSize = 0;
  (this->super_TcpSocket)._recvSize = 0;
  (this->super_TcpSocket)._lastport = 0;
  (this->super_TcpSocket)._inbuf = (char *)0x0;
  (this->super_TcpSocket)._readptr = (char *)0x0;
  (this->super_TcpSocket)._s = -1;
  (this->super_TcpSocket)._host._M_dataplus._M_p = (pointer)&(this->super_TcpSocket)._host.field_2;
  (this->super_TcpSocket)._host._M_string_length = 0;
  (this->super_TcpSocket)._host.field_2._M_local_buf[0] = '\0';
  (this->super_TcpSocket)._sslctx = (void *)0x0;
  (this->super_TcpSocket)._vptr_TcpSocket = (_func_int **)&PTR__HttpSocket_0010ec98;
  (this->_user_agent)._M_dataplus._M_p = (pointer)&(this->_user_agent).field_2;
  (this->_user_agent)._M_string_length = 0;
  (this->_user_agent).field_2._M_local_buf[0] = '\0';
  (this->_accept_encoding)._M_dataplus._M_p = (pointer)&(this->_accept_encoding).field_2;
  (this->_accept_encoding)._M_string_length = 0;
  (this->_accept_encoding).field_2._M_local_buf[0] = '\0';
  (this->_tmpHdr)._M_dataplus._M_p = (pointer)&(this->_tmpHdr).field_2;
  (this->_tmpHdr)._M_string_length = 0;
  (this->_tmpHdr).field_2._M_local_buf[0] = '\0';
  this->_keep_alive = 0;
  this->_remaining = 0;
  *(undefined4 *)
   ((long)&(this->_requestQ).c.
           super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
           super__Deque_impl_data._M_finish._M_node + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_requestQ).c.
           super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
           super__Deque_impl_data._M_finish._M_first + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_requestQ).c.
           super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
           super__Deque_impl_data._M_finish._M_last + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_requestQ).c.
           super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
           super__Deque_impl_data._M_start._M_node + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_requestQ).c.
           super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_requestQ).c.
           super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
           super__Deque_impl_data._M_start._M_first + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_requestQ).c.
           super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
           super__Deque_impl_data._M_start._M_last + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_requestQ).c.
           super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
           super__Deque_impl_data._M_map_size + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_requestQ).c.
           super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur + 4) = 0;
  *(undefined8 *)&this->_status = 0;
  *(undefined8 *)
   ((long)&(this->_requestQ).c.
           super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
           super__Deque_impl_data._M_map + 4) = 0;
  std::_Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>::_M_initialize_map
            ((_Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_> *)&this->_requestQ,
             0);
  p_Var1 = &(this->_hdrs)._M_t._M_impl.super__Rb_tree_header;
  (this->_hdrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_hdrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_hdrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_hdrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_hdrs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_curRequest).protocol._M_dataplus._M_p = (pointer)&(this->_curRequest).protocol.field_2;
  (this->_curRequest).protocol._M_string_length = 0;
  (this->_curRequest).protocol.field_2._M_local_buf[0] = '\0';
  (this->_curRequest).host._M_dataplus._M_p = (pointer)&(this->_curRequest).host.field_2;
  (this->_curRequest).host._M_string_length = 0;
  (this->_curRequest).host.field_2._M_local_buf[0] = '\0';
  (this->_curRequest).header._M_dataplus._M_p = (pointer)&(this->_curRequest).header.field_2;
  (this->_curRequest).header._M_string_length = 0;
  (this->_curRequest).header.field_2._M_local_buf[0] = '\0';
  (this->_curRequest).resource._M_dataplus._M_p = (pointer)&(this->_curRequest).resource.field_2;
  (this->_curRequest).resource._M_string_length = 0;
  (this->_curRequest).resource.field_2._M_local_buf[0] = '\0';
  (this->_curRequest).extraGetHeaders._M_dataplus._M_p =
       (pointer)&(this->_curRequest).extraGetHeaders.field_2;
  (this->_curRequest).extraGetHeaders._M_string_length = 0;
  (this->_curRequest).extraGetHeaders.field_2._M_local_buf[0] = '\0';
  (this->_curRequest).port = 0x50;
  (this->_curRequest).user = (void *)0x0;
  (this->_curRequest).post.data._M_dataplus._M_p = (pointer)&(this->_curRequest).post.data.field_2;
  (this->_curRequest).post.data._M_string_length = 0;
  (this->_curRequest).post.data.field_2._M_local_buf[0] = '\0';
  this->_inProgress = false;
  this->_chunkedTransfer = false;
  this->_mustClose = true;
  this->_followRedir = true;
  this->_alwaysHandle = false;
  return;
}

Assistant:

HttpSocket::HttpSocket()
	: TcpSocket()
	, _keep_alive(0)
	, _remaining(0)
	, _status(0)
	, _inProgress(false)
	, _chunkedTransfer(false)
	, _mustClose(true)
	, _followRedir(true)
	, _alwaysHandle(false)
{
}